

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

void Gia_ManFindXorInt(word *pOff,word *pOn,Vec_Int_t *vBinate,Vec_Ptr_t *vDivs,int nWords,
                      Vec_Int_t *vUnatePairs)

{
  int iVar1;
  int iVar2;
  int i;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  word *pIn0;
  int i_00;
  int nWords_00;
  int c;
  int i_01;
  
  nWords_00 = (int)vUnatePairs;
  iVar1 = vBinate->nSize;
  i_00 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  do {
    if (i_00 == iVar1) {
      return;
    }
    iVar2 = Vec_IntEntry(vBinate,i_00);
    for (i_01 = 0; i_00 != i_01; i_01 = i_01 + 1) {
      i = Vec_IntEntry(vBinate,i_01);
      iVar4 = iVar2;
      if (i < iVar2) {
        iVar4 = i;
      }
      if (i <= iVar2) {
        i = iVar2;
      }
      pvVar6 = Vec_PtrEntry(vDivs,iVar4);
      pIn0 = (word *)Vec_PtrEntry(vDivs,i);
      c = 0;
      iVar3 = Abc_TtIntersectXor(pOff,(int)pvVar6,pIn0,(word *)0x0,nWords,nWords_00);
      if (iVar3 == 0) {
LAB_00615754:
        iVar4 = Abc_Var2Lit(iVar4,0);
        uVar5 = Abc_Var2Lit(i,0);
        iVar4 = Abc_Var2Lit(iVar4 << 0xf | uVar5,c);
        Vec_IntPush(vUnatePairs,iVar4);
      }
      else {
        c = 1;
        iVar3 = Abc_TtIntersectXor(pOff,(int)pvVar6,pIn0,(word *)0x1,nWords,nWords_00);
        if (iVar3 == 0) goto LAB_00615754;
      }
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void Gia_ManFindXorInt( word * pOff, word * pOn, Vec_Int_t * vBinate, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnatePairs )
{
    int i, k, iDiv0_, iDiv1_;
    int Limit2 = Vec_IntSize(vBinate);//Abc_MinInt( Vec_IntSize(vBinate), 100 );
    Vec_IntForEachEntryStop( vBinate, iDiv1_, i, Limit2 )
    Vec_IntForEachEntryStop( vBinate, iDiv0_, k, i )
    {
        int iDiv0 = Abc_MinInt( iDiv0_, iDiv1_ );
        int iDiv1 = Abc_MaxInt( iDiv0_, iDiv1_ );
        word * pDiv0 = (word *)Vec_PtrEntry(vDivs, iDiv0);
        word * pDiv1 = (word *)Vec_PtrEntry(vDivs, iDiv1);
        if ( !Abc_TtIntersectXor( pOff, 0, pDiv0, pDiv1, 0, nWords ) )
            Vec_IntPush( vUnatePairs, Abc_Var2Lit((Abc_Var2Lit(iDiv0, 0) << 15) | Abc_Var2Lit(iDiv1, 0), 0) );
        else if ( !Abc_TtIntersectXor( pOff, 0, pDiv0, pDiv1, 1, nWords ) )
            Vec_IntPush( vUnatePairs, Abc_Var2Lit((Abc_Var2Lit(iDiv0, 0) << 15) | Abc_Var2Lit(iDiv1, 0), 1) );
    }
}